

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<bool,_proto2_unittest::TestAllTypes_NestedEnum>::iterator,_bool> *
__thiscall
google::protobuf::Map<bool,proto2_unittest::TestAllTypes_NestedEnum>::
TryEmplaceInternal<bool_const&>
          (pair<google::protobuf::Map<bool,_proto2_unittest::TestAllTypes_NestedEnum>::iterator,_bool>
           *__return_storage_ptr__,void *this,bool *k)

{
  BaseIt it;
  BaseIt it_00;
  undefined8 args;
  bool bVar1;
  NodeBase *node_00;
  NodeAndBucket NVar2;
  bool local_b9;
  NodeBase *local_b8;
  void *local_b0;
  map_index_t local_a8;
  undefined4 uStack_a4;
  iterator local_a0;
  NodeBase *local_88;
  Node *node;
  NodeBase *local_78;
  void *local_70;
  map_index_t local_68;
  undefined4 uStack_64;
  iterator local_60;
  map_index_t local_44;
  NodeBase *pNStack_40;
  map_index_t b;
  NodeAndBucket p;
  bool *k_local;
  Map<bool,_proto2_unittest::TestAllTypes_NestedEnum> *this_local;
  Node *node_1;
  
  p._8_8_ = k;
  bVar1 = internal::TransparentSupport<bool>::ToView((bool)(*k & 1));
  NVar2 = internal::KeyMapBase<bool>::FindHelper((KeyMapBase<bool> *)this,bVar1);
  local_78 = NVar2.node;
  local_68 = NVar2.bucket;
  local_44 = local_68;
  pNStack_40 = local_78;
  p.node._0_4_ = local_68;
  if (local_78 == (NodeBase *)0x0) {
    bVar1 = internal::KeyMapBase<bool>::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<bool> *)this,(ulong)(*this + 1));
    if (bVar1) {
      bVar1 = internal::TransparentSupport<bool>::ToView((bool)(*(byte *)p._8_8_ & 1));
      local_44 = internal::KeyMapBase<bool>::BucketNumber((KeyMapBase<bool> *)this,bVar1);
    }
    args = p._8_8_;
    node_00 = internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x10);
    bVar1 = internal::InitializeMapKey<bool,bool_const&>
                      ((bool *)(node_00 + 1),(bool *)args,*(Arena **)((long)this + 0x18));
    if (!bVar1) {
      Arena::CreateInArenaStorage<bool,bool_const&>
                ((bool *)(node_00 + 1),*(Arena **)((long)this + 0x18),(bool *)args);
    }
    Arena::CreateInArenaStorage<proto2_unittest::TestAllTypes_NestedEnum>
              ((TestAllTypes_NestedEnum *)((long)&node_00[1].next + 4),
               *(Arena **)((long)this + 0x18));
    local_88 = node_00;
    internal::KeyMapBase<bool>::InsertUnique((KeyMapBase<bool> *)this,local_44,(KeyNode *)node_00);
    *(int *)this = *this + 1;
    local_b8 = local_88;
    local_a8 = local_44;
    it_00._20_4_ = uStack_a4;
    it_00.bucket_index_ = local_44;
    it_00.m_ = (UntypedMapBase *)this;
    it_00.node_ = local_88;
    local_b0 = this;
    Map<bool,_proto2_unittest::TestAllTypes_NestedEnum>::iterator::iterator(&local_a0,it_00);
    local_b9 = true;
    std::
    make_pair<google::protobuf::Map<bool,proto2_unittest::TestAllTypes_NestedEnum>::iterator,bool>
              (__return_storage_ptr__,&local_a0,&local_b9);
  }
  else {
    it._20_4_ = uStack_64;
    it.bucket_index_ = local_68;
    it.m_ = (UntypedMapBase *)this;
    it.node_ = local_78;
    local_70 = this;
    Map<bool,_proto2_unittest::TestAllTypes_NestedEnum>::iterator::iterator(&local_60,it);
    node._7_1_ = 0;
    std::
    make_pair<google::protobuf::Map<bool,proto2_unittest::TestAllTypes_NestedEnum>::iterator,bool>
              (__return_storage_ptr__,&local_60,(bool *)((long)&node + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }